

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O2

int luaopen_package(lua_State *L)

{
  undefined **ppuVar1;
  long n;
  
  lua_createtable(L,0,0);
  lua_createtable(L,0,1);
  lua_pushcclosure(L,gctm,0);
  lua_setfield(L,-2,"__gc");
  lua_setmetatable(L,-2);
  lua_rawsetp(L,-0xf4628,&CLIBS);
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,7);
  luaL_setfuncs(L,pk_funcs,0);
  lua_createtable(L,4,0);
  ppuVar1 = &createsearcherstable_searchers;
  for (n = 1; n != 5; n = n + 1) {
    lua_pushvalue(L,-2);
    lua_pushcclosure(L,(lua_CFunction)*ppuVar1,1);
    lua_rawseti(L,-2,n);
    ppuVar1 = ppuVar1 + 1;
  }
  lua_setfield(L,-2,"searchers");
  setpath(L,"path","LUA_PATH",
          "/usr/local/share/lua/5.3/?.lua;/usr/local/share/lua/5.3/?/init.lua;/usr/local/lib/lua/5.3/?.lua;/usr/local/lib/lua/5.3/?/init.lua;./?.lua;./?/init.lua"
         );
  setpath(L,"cpath","LUA_CPATH",
          "/usr/local/lib/lua/5.3/?.so;/usr/local/lib/lua/5.3/loadall.so;./?.so");
  lua_pushstring(L,"/\n;\n?\n!\n-\n");
  lua_setfield(L,-2,"config");
  luaL_getsubtable(L,-0xf4628,"_LOADED");
  lua_setfield(L,-2,"loaded");
  luaL_getsubtable(L,-0xf4628,"_PRELOAD");
  lua_setfield(L,-2,"preload");
  lua_rawgeti(L,-0xf4628,2);
  lua_pushvalue(L,-2);
  luaL_setfuncs(L,ll_funcs,1);
  lua_settop(L,-2);
  return 1;
}

Assistant:

LUAMOD_API int luaopen_package(lua_State *L) {
    createclibstable(L);
    luaL_newlib(L, pk_funcs);  /* create 'package' table */
    createsearcherstable(L);
    /* set paths */
    setpath(L, "path", LUA_PATH_VAR, LUA_PATH_DEFAULT);
    setpath(L, "cpath", LUA_CPATH_VAR, LUA_CPATH_DEFAULT);
    /* store config information */
    lua_pushliteral(L, LUA_DIRSEP
            "\n"
            LUA_PATH_SEP
            "\n"
            LUA_PATH_MARK
            "\n"
            LUA_EXEC_DIR
            "\n"
            LUA_IGMARK
            "\n");
    lua_setfield(L, -2, "config");
    /* set field 'loaded' */
    luaL_getsubtable(L, LUA_REGISTRYINDEX, LUA_LOADED_TABLE);
    lua_setfield(L, -2, "loaded");
    /* set field 'preload' */
    luaL_getsubtable(L, LUA_REGISTRYINDEX, LUA_PRELOAD_TABLE);
    lua_setfield(L, -2, "preload");
    lua_pushglobaltable(L);
    lua_pushvalue(L, -2);  /* set 'package' as upvalue for next lib */
    luaL_setfuncs(L, ll_funcs, 1);  /* open lib into global table */
    lua_pop(L, 1);  /* pop global table */
    return 1;  /* return 'package' table */
}